

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O3

double inform_mutual_info(int *series,size_t l,size_t n,int *b,inform_error *err)

{
  int iVar1;
  uint32_t *puVar2;
  _Bool _Var3;
  inform_dist **marginals;
  inform_dist *piVar4;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  size_t i;
  double dVar9;
  
  _Var3 = check_arguments(series,l,n,b,err);
  if (_Var3) {
    return NAN;
  }
  marginals = (inform_dist **)malloc(l * 8);
  if (marginals == (inform_dist **)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
LAB_00159d0a:
    dVar9 = NAN;
  }
  else {
    if (l == 0) {
      piVar4 = inform_dist_alloc(1);
      if (piVar4 == (inform_dist *)0x0) {
LAB_00159cf6:
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        free(marginals);
        goto LAB_00159d0a;
      }
      piVar4->counts = n;
    }
    else {
      sVar5 = 1;
      sVar8 = 0;
      do {
        iVar1 = b[sVar8];
        piVar4 = inform_dist_alloc((long)iVar1);
        marginals[sVar8] = piVar4;
        if (piVar4 == (inform_dist *)0x0) {
          if (sVar8 != 0) {
            sVar5 = 0;
            do {
              inform_dist_free(marginals[sVar5]);
              sVar5 = sVar5 + 1;
            } while (sVar8 != sVar5);
          }
          goto LAB_00159cf6;
        }
        sVar5 = sVar5 * (long)iVar1;
        sVar8 = sVar8 + 1;
      } while (l != sVar8);
      piVar4 = inform_dist_alloc(sVar5);
      if (piVar4 == (inform_dist *)0x0) {
        sVar5 = 0;
        do {
          inform_dist_free(marginals[sVar5]);
          sVar5 = sVar5 + 1;
        } while (l != sVar5);
        goto LAB_00159cf6;
      }
      piVar4->counts = n;
      sVar5 = 0;
      do {
        marginals[sVar5]->counts = n;
        sVar5 = sVar5 + 1;
      } while (l != sVar5);
    }
    if (n != 0) {
      puVar2 = piVar4->histogram;
      sVar5 = 0;
      do {
        if (l == 0) {
          lVar7 = 0;
        }
        else {
          sVar8 = 0;
          lVar7 = 0;
          piVar6 = series;
          do {
            lVar7 = b[sVar8] * lVar7 + (long)*piVar6;
            marginals[sVar8]->histogram[*piVar6] = marginals[sVar8]->histogram[*piVar6] + 1;
            sVar8 = sVar8 + 1;
            piVar6 = piVar6 + n;
          } while (l != sVar8);
        }
        puVar2[lVar7] = puVar2[lVar7] + 1;
        sVar5 = sVar5 + 1;
        series = series + 1;
      } while (sVar5 != n);
    }
    dVar9 = inform_shannon_multi_mi(piVar4,marginals,l,2.0);
    inform_dist_free(piVar4);
    if (l != 0) {
      sVar5 = 0;
      do {
        inform_dist_free(marginals[sVar5]);
        sVar5 = sVar5 + 1;
      } while (l != sVar5);
    }
    free(marginals);
  }
  return dVar9;
}

Assistant:

double inform_mutual_info(int const *series, size_t l, size_t n, int const *b,
    inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NAN;

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        free(marginals);
        return NAN;
    }

    accumulate(series, l, n, b, joint, marginals);

    double mi = inform_shannon_multi_mi(joint, (inform_dist const **)marginals, l, 2.0);

    free_all(&joint, marginals, l);

    return mi;
}